

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *out;
  ColourGuard guard;
  ColourGuard local_28;
  
  out = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  Catch::operator<<(out,(lineOfChars)0x2d);
  std::operator<<(out,'\n');
  local_28.m_colourImpl =
       Detail::unique_ptr<Catch::ColourImpl>::operator->
                 (&(this->super_StreamingReporterBase).super_ReporterBase.m_colour);
  local_28.m_code = Headers;
  local_28.m_engaged = false;
  ColourImpl::ColourGuard::engageImpl
            (&local_28,(this->super_StreamingReporterBase).super_ReporterBase.m_stream);
  guard.m_colourImpl = local_28.m_colourImpl;
  guard.m_code = local_28.m_code;
  guard.m_engaged = local_28.m_engaged;
  local_28.m_engaged = false;
  ColourImpl::ColourGuard::~ColourGuard(&local_28);
  printHeaderString(this,_name,0);
  ColourImpl::ColourGuard::~ColourGuard(&guard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    m_stream << lineOfChars('-') << '\n';
    {
        auto guard = m_colour->guardColour( Colour::Headers ).engage( m_stream );
        printHeaderString(_name);
    }
}